

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alhelpers.c
# Opt level: O3

void CloseAL(void)

{
  long lVar1;
  undefined8 uVar2;
  
  lVar1 = alcGetCurrentContext();
  if (lVar1 != 0) {
    uVar2 = alcGetContextsDevice(lVar1);
    alcMakeContextCurrent(0);
    alcDestroyContext(lVar1);
    alcCloseDevice(uVar2);
    return;
  }
  return;
}

Assistant:

void CloseAL(void)
{
    ALCdevice *device;
    ALCcontext *ctx;

    ctx = alcGetCurrentContext();
    if(ctx == NULL)
        return;

    device = alcGetContextsDevice(ctx);

    alcMakeContextCurrent(NULL);
    alcDestroyContext(ctx);
    alcCloseDevice(device);
}